

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::OutputFile::setFrameBuffer(OutputFile *this,FrameBuffer *frameBuffer)

{
  _Base_ptr name;
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  pointer pOVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  undefined7 uVar6;
  PixelType PVar7;
  undefined4 uVar8;
  pointer __src;
  int iVar9;
  OutSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar10;
  ConstIterator CVar11;
  ConstIterator CVar12;
  const_iterator cVar13;
  pointer pOVar14;
  pointer pOVar15;
  ostream *poVar16;
  char *pcVar17;
  ArgExc *pAVar18;
  size_t __n;
  ulong __n_00;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  slices;
  stringstream _iex_throw_s;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  local_1d8;
  undefined1 local_1b8 [16];
  size_t sStack_1a8;
  size_t sStack_1a0;
  undefined8 local_198;
  bool local_190;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar9 = pthread_mutex_lock(__mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  this_00 = Header::channels(&this->_data->header);
  cVar10._M_node = (_Base_ptr)ChannelList::begin(this_00);
  do {
    CVar11 = ChannelList::end(this_00);
    if ((const_iterator)cVar10._M_node == CVar11._i._M_node) {
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar10._M_node = (_Base_ptr)ChannelList::begin(this_00);
      while( true ) {
        CVar11 = ChannelList::end(this_00);
        if ((const_iterator)cVar10._M_node == CVar11._i._M_node) break;
        CVar12 = FrameBuffer::find(frameBuffer,(char *)(cVar10._M_node + 1));
        cVar13._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
        if (CVar12._i._M_node == (const_iterator)cVar13._M_node) {
          local_1b8._0_4_ = cVar10._M_node[9]._M_color;
          local_1b8._8_8_ = (char *)0x0;
          sStack_1a8 = 0;
          sStack_1a0 = 0;
          local_198 = *(undefined8 *)&cVar10._M_node[9].field_0x4;
          local_190 = true;
          std::
          vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        else {
          local_1b8._0_4_ = *(_Rb_tree_color *)((long)CVar12._i._M_node + 0x120);
          local_1b8._8_8_ = *(undefined8 *)((long)CVar12._i._M_node + 0x128);
          sStack_1a8 = *(size_t *)((long)CVar12._i._M_node + 0x130);
          sStack_1a0 = *(size_t *)((long)CVar12._i._M_node + 0x138);
          local_198 = *(undefined8 *)((long)CVar12._i._M_node + 0x140);
          local_190 = false;
          std::
          vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back(&local_1d8,(value_type *)local_1b8);
        }
        cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&this->_data->frameBuffer,
                  (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)frameBuffer);
      pOVar2 = local_1d8.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __src = local_1d8.
              super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = this->_data;
      __n_00 = (long)local_1d8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1d8.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pOVar14 = (pDVar1->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar1->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar14) < __n_00
         ) {
        pOVar14 = std::
                  _Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                                 *)(((long)__n_00 >> 4) * -0x5555555555555555),(size_t)frameBuffer);
        if (__src != pOVar2) {
          memcpy(pOVar14,__src,((__n_00 - 0x30) / 0x30) * 0x30 + 0x30);
        }
        pOVar2 = (pDVar1->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar2 != (pointer)0x0) {
          operator_delete(pOVar2,(long)(pDVar1->slices).
                                       super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pOVar2);
        }
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pOVar14;
        (pDVar1->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pOVar14 + __n_00);
      }
      else {
        pOVar15 = (pDVar1->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pOVar15 - (long)pOVar14;
        if (__n < __n_00) {
          if (pOVar15 != pOVar14) {
            memmove(pOVar14,local_1d8.
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
            pOVar15 = (pDVar1->slices).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __n = (long)pOVar15 -
                  (long)(pDVar1->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          }
          for (pOVar14 = (pointer)((long)&__src->type + __n); pOVar14 != pOVar2;
              pOVar14 = pOVar14 + 1) {
            PVar7 = pOVar14->type;
            uVar8 = *(undefined4 *)&pOVar14->field_0x4;
            pcVar17 = pOVar14->base;
            sVar3 = pOVar14->xStride;
            sVar4 = pOVar14->yStride;
            iVar9 = pOVar14->ySampling;
            bVar5 = pOVar14->zero;
            uVar6 = *(undefined7 *)&pOVar14->field_0x29;
            pOVar15->xSampling = pOVar14->xSampling;
            pOVar15->ySampling = iVar9;
            pOVar15->zero = bVar5;
            *(undefined7 *)&pOVar15->field_0x29 = uVar6;
            pOVar15->xStride = sVar3;
            pOVar15->yStride = sVar4;
            pOVar15->type = PVar7;
            *(undefined4 *)&pOVar15->field_0x4 = uVar8;
            pOVar15->base = pcVar17;
            pOVar15 = pOVar15 + 1;
          }
        }
        else if (local_1d8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 local_1d8.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pOVar14,local_1d8.
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)(pDVar1->slices).
                           super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start + __n_00);
      if (__src != (pointer)0x0) {
        operator_delete(__src,(long)local_1d8.
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src
                       );
      }
      pthread_mutex_unlock(__mutex);
      return;
    }
    name = cVar10._M_node + 1;
    CVar12 = FrameBuffer::find(frameBuffer,(char *)name);
    cVar13._M_node = (_Base_ptr)FrameBuffer::end(frameBuffer);
    if (CVar12._i._M_node != (const_iterator)cVar13._M_node) {
      if (cVar10._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar12._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"Pixel type of \"",0xf);
        poVar16 = std::operator<<((ostream *)&sStack_1a8,(char *)name);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" channel of output file \"",0x1a);
        pcVar17 = OStream::fileName(this->_data->_streamData->os);
        poVar16 = std::operator<<(poVar16,pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)local_1b8);
        __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      if ((*(int *)&cVar10._M_node[9].field_0x4 != *(int *)((long)CVar12._i._M_node + 0x140)) ||
         (*(int *)&cVar10._M_node[9]._M_parent != *(int *)((long)CVar12._i._M_node + 0x144))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&sStack_1a8,"X and/or y subsampling factors of \"",0x23);
        poVar16 = std::operator<<((ostream *)&sStack_1a8,(char *)name);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" channel of output file \"",0x1a);
        pcVar17 = OStream::fileName(this->_data->_streamData->os);
        poVar16 = std::operator<<(poVar16,pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" are not compatible with the frame buffer\'s subsampling factors.",
                   0x41);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)local_1b8);
        __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
    }
    cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
  } while( true );
}

Assistant:

void	
OutputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);
    
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	    continue;

	if (i.channel().type != j.slice().type)
	{
	    THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
			        "of output file \"" << fileName() << "\" is "
			        "not compatible with the frame buffer's "
			        "pixel type.");
	}

	if (i.channel().xSampling != j.slice().xSampling ||
	    i.channel().ySampling != j.slice().ySampling)
	{
	    THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
				"of \"" << i.name() << "\" channel "
				"of output file \"" << fileName() << "\" are "
				"not compatible with the frame buffer's "
				"subsampling factors.");
	}
    }
    
    //
    // Initialize slice table for writePixels().
    //

    vector<OutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	{
	    //
	    // Channel i is not present in the frame buffer.
	    // In the file, channel i will contain only zeroes.
	    //

	    slices.push_back (OutSliceInfo (i.channel().type,
					    0, // base
					    0, // xStride,
					    0, // yStride,
					    i.channel().xSampling,
					    i.channel().ySampling,
					    true)); // zero
	}
	else
	{
	    //
	    // Channel i is present in the frame buffer.
	    //

	    slices.push_back (OutSliceInfo (j.slice().type,
					    j.slice().base,
					    j.slice().xStride,
					    j.slice().yStride,
					    j.slice().xSampling,
					    j.slice().ySampling,
					    false)); // zero
	}
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}